

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

void save_mb_rd_info(int n4,uint32_t hash,MACROBLOCK *x,RD_STATS *rd_stats,
                    MB_RD_RECORD *mb_rd_record)

{
  MB_RD_INFO *pMVar1;
  int iVar2;
  MB_MODE_INFO *pMVar3;
  undefined8 uVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  undefined7 uVar8;
  int iVar9;
  
  iVar9 = mb_rd_record->index_start;
  iVar2 = mb_rd_record->num;
  if (iVar2 < 8) {
    iVar9 = (iVar9 + iVar2) % 8;
    mb_rd_record->num = iVar2 + 1;
  }
  else {
    mb_rd_record->index_start = (iVar9 + 1) % 8;
  }
  pMVar3 = *(x->e_mbd).mi;
  pMVar1 = mb_rd_record->mb_rd_info + iVar9;
  pMVar1->hash_value = hash;
  pMVar1->tx_size = pMVar3->tx_size;
  memcpy(pMVar1->blk_skip,(x->txfm_search_info).blk_skip,(long)n4);
  uVar4 = *(undefined8 *)(pMVar3->inter_tx_size + 8);
  *(undefined8 *)pMVar1->inter_tx_size = *(undefined8 *)pMVar3->inter_tx_size;
  *(undefined8 *)(pMVar1->inter_tx_size + 8) = uVar4;
  memcpy(mb_rd_record->mb_rd_info[iVar9].tx_type_map,(x->e_mbd).tx_type_map,(long)n4);
  iVar2 = rd_stats->zero_rate;
  iVar5 = rd_stats->dist;
  iVar6 = rd_stats->rdcost;
  iVar7 = rd_stats->sse;
  mb_rd_record->mb_rd_info[iVar9].rd_stats.rate = rd_stats->rate;
  mb_rd_record->mb_rd_info[iVar9].rd_stats.zero_rate = iVar2;
  mb_rd_record->mb_rd_info[iVar9].rd_stats.dist = iVar5;
  mb_rd_record->mb_rd_info[iVar9].rd_stats.rdcost = iVar6;
  mb_rd_record->mb_rd_info[iVar9].rd_stats.sse = iVar7;
  uVar8 = *(undefined7 *)&rd_stats->field_0x21;
  mb_rd_record->mb_rd_info[iVar9].rd_stats.skip_txfm = rd_stats->skip_txfm;
  *(undefined7 *)&mb_rd_record->mb_rd_info[iVar9].rd_stats.field_0x21 = uVar8;
  return;
}

Assistant:

static inline void save_mb_rd_info(int n4, uint32_t hash,
                                   const MACROBLOCK *const x,
                                   const RD_STATS *const rd_stats,
                                   MB_RD_RECORD *mb_rd_record) {
  int index;
  if (mb_rd_record->num < RD_RECORD_BUFFER_LEN) {
    index =
        (mb_rd_record->index_start + mb_rd_record->num) % RD_RECORD_BUFFER_LEN;
    ++mb_rd_record->num;
  } else {
    index = mb_rd_record->index_start;
    mb_rd_record->index_start =
        (mb_rd_record->index_start + 1) % RD_RECORD_BUFFER_LEN;
  }
  MB_RD_INFO *const mb_rd_info = &mb_rd_record->mb_rd_info[index];
  const MACROBLOCKD *const xd = &x->e_mbd;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  mb_rd_info->hash_value = hash;
  mb_rd_info->tx_size = mbmi->tx_size;
  memcpy(mb_rd_info->blk_skip, x->txfm_search_info.blk_skip,
         sizeof(mb_rd_info->blk_skip[0]) * n4);
  av1_copy(mb_rd_info->inter_tx_size, mbmi->inter_tx_size);
  av1_copy_array(mb_rd_info->tx_type_map, xd->tx_type_map, n4);
  mb_rd_info->rd_stats = *rd_stats;
}